

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

char16_t * PAL_wcspbrk(char16_t *string,char16_t *strCharSet)

{
  char16_t *pcVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    for (; *string != L'\0'; string = string + 1) {
      pcVar1 = PAL_wcschr(strCharSet,*string);
      if (pcVar1 != (char16_t *)0x0) {
        if (PAL_InitializeChakraCoreCalled != false) {
          return string;
        }
        goto LAB_00312ac6;
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return (char16_t *)0x0;
    }
  }
LAB_00312ac6:
  abort();
}

Assistant:

const char16_t *
__cdecl
PAL_wcspbrk(
        const char16_t *string,
        const char16_t *strCharSet)
{
    PERF_ENTRY(wcspbrk);
    ENTRY("wcspbrk (string=%p (%S), strCharSet=%p (%S))\n",
          string?string:W16_NULLSTRING,
          string?string:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING);

    while (*string)
    {
        if (PAL_wcschr(strCharSet, *string) != NULL)
        {
            LOGEXIT("wcspbrk returning char16_t %p (%S)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING);
            PERF_EXIT(wcspbrk);
            return (char16_t *) string;
        }

        string++;
    }

    LOGEXIT("wcspbrk returning char16_t NULL\n");
    PERF_EXIT(wcspbrk);
    return NULL;
}